

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcAnalyzer.cpp
# Opt level: O2

void __thiscall HdlcAnalyzer::SetupAnalyzer(HdlcAnalyzer *this)

{
  uint uVar1;
  pointer puVar2;
  uint uVar3;
  BitState BVar4;
  AnalyzerChannelData *pAVar5;
  ulong uVar6;
  double dVar7;
  
  pAVar5 = (AnalyzerChannelData *)Analyzer::GetAnalyzerChannelData((Channel *)this);
  this->mHdlc = pAVar5;
  uVar1 = ((this->mSettings)._M_ptr)->mBitRate;
  uVar3 = Analyzer::GetSampleRate();
  this->mSampleRateHz = uVar3;
  dVar7 = ((double)uVar3 * (1.0 / (double)uVar1) * 1000000.0) / 1000000.0;
  uVar6 = (ulong)dVar7;
  uVar6 = (long)(dVar7 - 9.223372036854776e+18) & (long)uVar6 >> 0x3f | uVar6;
  this->mSamplesInHalfPeriod = uVar6;
  this->mSamplesInAFlag = uVar6 * 7;
  this->mSamplesIn8Bits = (int)uVar6 << 3;
  BVar4 = AnalyzerChannelData::GetBitState();
  this->mPreviousBitState = BVar4;
  this->mConsecutiveOnes = 0;
  this->mReadingFrame = false;
  this->mAbortFrame = false;
  this->mCurrentFrameIsSFrame = false;
  this->mFoundEndFlag = false;
  std::vector<Frame,_std::allocator<Frame>_>::clear(&this->mResultFrames);
  puVar2 = (this->mCurrentFrameBytes).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->mCurrentFrameBytes).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish != puVar2) {
    (this->mCurrentFrameBytes).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = puVar2;
  }
  return;
}

Assistant:

void HdlcAnalyzer::SetupAnalyzer()
{
    mHdlc = GetAnalyzerChannelData( mSettings->mInputChannel );

    double halfPeriod = ( 1.0 / double( mSettings->mBitRate ) ) * 1000000.0;
    mSampleRateHz = GetSampleRate();
    mSamplesInHalfPeriod = U64( ( mSampleRateHz * halfPeriod ) / 1000000.0 );
    mSamplesInAFlag = mSamplesInHalfPeriod * 7;
    mSamplesIn8Bits = mSamplesInHalfPeriod * 8;

    mPreviousBitState = mHdlc->GetBitState();
    mConsecutiveOnes = 0;
    mReadingFrame = false;
    mAbortFrame = false;
    mCurrentFrameIsSFrame = false;
    mFoundEndFlag = false;

    mResultFrames.clear();
    mCurrentFrameBytes.clear();
}